

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

char * Gia_FileNameGenericAppend(char *pBase,char *pSuffix)

{
  char *pcVar1;
  
  strcpy(Gia_FileNameGenericAppend::Buffer,pBase);
  pcVar1 = strrchr(Gia_FileNameGenericAppend::Buffer,0x2e);
  if (pcVar1 != (char *)0x0) {
    *pcVar1 = '\0';
  }
  strcat(Gia_FileNameGenericAppend::Buffer,pSuffix);
  pcVar1 = strrchr(Gia_FileNameGenericAppend::Buffer,0x5c);
  if ((pcVar1 == (char *)0x0) &&
     (pcVar1 = strrchr(Gia_FileNameGenericAppend::Buffer,0x2f), pcVar1 == (char *)0x0)) {
    return Gia_FileNameGenericAppend::Buffer;
  }
  return pcVar1 + 1;
}

Assistant:

char * Gia_FileNameGenericAppend( char * pBase, char * pSuffix )
{
    static char Buffer[1000];
    char * pDot;
    strcpy( Buffer, pBase );
    if ( (pDot = strrchr( Buffer, '.' )) )
        *pDot = 0;
    strcat( Buffer, pSuffix );
    if ( (pDot = strrchr( Buffer, '\\' )) || (pDot = strrchr( Buffer, '/' )) )
        return pDot+1;
    return Buffer;
}